

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O2

void __thiscall CCountryFlags::LoadCountryflagsIndexfile(CCountryFlags *this)

{
  long lVar1;
  IStorage *pIVar2;
  IConsole *pIVar3;
  IGraphics *pIVar4;
  ulong uVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  char *pcVar8;
  json_value *this_00;
  _json_value *this_01;
  _json_value *this_02;
  _json_value *p_Var9;
  ulong uVar10;
  CCountryFlag *pCVar11;
  ulong uVar12;
  ulong uVar13;
  uint i;
  uint uVar14;
  long in_FS_OFFSET;
  CImageInfo Info;
  json_settings JsonSettings;
  char aMsg [64];
  CCountryFlag CountryFlag;
  char aBuf [64];
  char aError [256];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pStorage;
  iVar6 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])
                    (pIVar2,"countryflags/index.json",1,0xffffffffffffffff,0,0,0,0);
  io = (IOHANDLE)CONCAT44(extraout_var,iVar6);
  if (io == (IOHANDLE)0x0) {
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                (pIVar3,1,"countryflags","couldn\'t open index file",0);
      return;
    }
  }
  else {
    lVar7 = io_length(io);
    uVar14 = (uint)lVar7;
    pcVar8 = (char *)mem_alloc(uVar14);
    io_read(io,pcVar8,uVar14);
    io_close(io);
    mem_zero(&JsonSettings,0x30);
    this_00 = json_parse_ex(&JsonSettings,pcVar8,(long)(int)uVar14,aError);
    mem_free(pcVar8);
    if (this_00 == (json_value *)0x0) {
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                (pIVar3,1,"countryflags/index.json",aError,0);
    }
    else {
      this_01 = _json_value::operator[](this_00,"country codes");
      if (this_01->type == json_object) {
        for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
          this_02 = _json_value::operator[]
                              (this_01,(char *)((long)&DAT_001c9638 +
                                               (long)(int)(&DAT_001c9638)[lVar7]));
          if (this_02->type == json_array) {
            for (uVar14 = 0; uVar14 < (this_02->u).string.length; uVar14 = uVar14 + 1) {
              p_Var9 = _json_value::operator[](this_02,uVar14);
              p_Var9 = _json_value::operator[](p_Var9,"code");
              uVar10 = _json_value::operator_cast_to_long(p_Var9);
              if ((int)uVar10 - 1000U < 0xfffffc17) {
                str_format(aBuf,0x40,"country code \'%i\' not within valid code range [%i..%i]",
                           uVar10 & 0xffffffff);
                pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
                (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,1,"countryflags",aBuf);
              }
              else {
                p_Var9 = _json_value::operator[](this_02,uVar14);
                p_Var9 = _json_value::operator[](p_Var9,"id");
                pcVar8 = "";
                if (p_Var9->type == json_string) {
                  pcVar8 = (p_Var9->u).string.ptr;
                }
                CountryFlag.m_Texture.m_Id = -1;
                CountryFlag.m_CountryCode = (int)uVar10;
                str_copy(CountryFlag.m_aCountryCodeString,pcVar8,8);
                if (((this->super_CComponent).m_pClient)->m_pConfig->m_ClLoadCountryFlags != 0) {
                  str_format(aBuf,0x40,"countryflags/%s.png",pcVar8);
                  pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                  iVar6 = (*(pIVar4->super_IInterface)._vptr_IInterface[0xe])
                                    (pIVar4,&Info,aBuf,0xffffffffffffffff);
                  if (iVar6 == 0) {
                    str_format(aMsg,0x40,"failed to load \'%s\'",aBuf);
                    pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
                    (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                              (pIVar3,1,"countryflags",aMsg,0);
                    goto LAB_00134d6e;
                  }
                  pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
                  CountryFlag.m_Texture.m_Id =
                       (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
                                 (pIVar4,(ulong)(uint)Info.m_Width,(ulong)(uint)Info.m_Height);
                  mem_free(Info.m_pData);
                }
                CountryFlag.m_Blocked = false;
                p_Var9 = _json_value::operator[](this_02,uVar14);
                p_Var9 = _json_value::operator[](p_Var9,"blocked");
                if ((p_Var9->type == json_boolean) && ((p_Var9->u).boolean != 0)) {
                  CountryFlag.m_Blocked = true;
                }
                array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                ::add(&(this->m_aCountryFlags).
                       super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                      ,&CountryFlag);
                if (((this->super_CComponent).m_pClient)->m_pConfig->m_Debug != 0) {
                  str_format(aBuf,0x40,"loaded country flag \'%s\'",pcVar8);
                  pIVar3 = ((this->super_CComponent).m_pClient)->m_pConsole;
                  (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,1,"countryflags",aBuf)
                  ;
                }
              }
LAB_00134d6e:
            }
          }
        }
      }
      json_value_free(this_00);
      sorted_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::
      sort_range(&this->m_aCountryFlags);
      aBuf._0_8_ = (this->m_aCountryFlags).
                   super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                   .list;
      aBuf._8_8_ = aBuf._0_8_ +
                   (long)(this->m_aCountryFlags).
                         super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                         .num_elements * 0x14;
      iVar6 = 0;
LAB_00134dbe:
      if ((ulong)aBuf._0_8_ < (ulong)aBuf._8_8_) {
        pCVar11 = plain_range<CCountryFlags::CCountryFlag>::front
                            ((plain_range<CCountryFlags::CCountryFlag> *)aBuf);
        if (pCVar11->m_CountryCode != -1) goto code_r0x00134dd8;
        if (iVar6 != 0) {
          for (lVar7 = 8; lVar7 != 0x3f1; lVar7 = lVar7 + 1) {
            this->m_CodeIndexLUT[lVar7 + -8] = -iVar6;
          }
          goto LAB_00134ec3;
        }
      }
      mem_zero(this->m_CodeIndexLUT,0xfa4);
LAB_00134ec3:
      uVar14 = (this->m_aCountryFlags).
               super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
               .num_elements;
      pCVar11 = (this->m_aCountryFlags).
                super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                .list;
      uVar10 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        uVar10 = 0;
      }
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        uVar5 = (long)(pCVar11->m_CountryCode + 1) % 0x3e9;
        uVar12 = uVar5 & 0xffffffff;
        if ((int)uVar5 < 1) {
          uVar12 = 0;
        }
        this->m_CodeIndexLUT[uVar12] = (int)uVar13;
        pCVar11 = pCVar11 + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
code_r0x00134dd8:
  plain_range<CCountryFlags::CCountryFlag>::pop_front
            ((plain_range<CCountryFlags::CCountryFlag> *)aBuf);
  iVar6 = iVar6 + -1;
  goto LAB_00134dbe;
}

Assistant:

void CCountryFlags::LoadCountryflagsIndexfile()
{
	// read file data into buffer
	const char *pFilename = "countryflags/index.json";
	IOHANDLE File = Storage()->OpenFile(pFilename, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", "couldn't open index file");
		return;
	}
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, pFilename, aError);
		return;
	}

	// extract data
	const json_value &rInit = (*pJsonData)["country codes"];
	if(rInit.type == json_object)
	{
		enum
		{
			NUM_INDICES = 2,
		};
		const char *paIndices[NUM_INDICES] = {"custom", "ISO 3166-1"};
		for(int Index = 0; Index < NUM_INDICES; ++Index)
		{
			const json_value &rStart = rInit[(const char *)paIndices[Index]];
			if(rStart.type == json_array)
			{
				for(unsigned i = 0; i < rStart.u.array.length; ++i)
				{
					char aBuf[64];

					// validate country code
					int CountryCode = (json_int_t)rStart[i]["code"];
					if(CountryCode < CODE_LB || CountryCode > CODE_UB)
					{
						str_format(aBuf, sizeof(aBuf), "country code '%i' not within valid code range [%i..%i]", CountryCode, CODE_LB, CODE_UB);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
						continue;
					}

					// add entry
					const char *pCountryName = rStart[i]["id"];
					CCountryFlag CountryFlag;
					CountryFlag.m_CountryCode = CountryCode;
					str_copy(CountryFlag.m_aCountryCodeString, pCountryName, sizeof(CountryFlag.m_aCountryCodeString));
					if(Config()->m_ClLoadCountryFlags)
					{
						// load the graphic file
						CImageInfo Info;
						str_format(aBuf, sizeof(aBuf), "countryflags/%s.png", pCountryName);
						if(!Graphics()->LoadPNG(&Info, aBuf, IStorage::TYPE_ALL))
						{
							char aMsg[64];
							str_format(aMsg, sizeof(aMsg), "failed to load '%s'", aBuf);
							Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aMsg);
							continue;
						}
						CountryFlag.m_Texture = Graphics()->LoadTextureRaw(Info.m_Width, Info.m_Height, Info.m_Format, Info.m_pData, Info.m_Format, 0);
						mem_free(Info.m_pData);
					}
					// blocked?
					CountryFlag.m_Blocked = false;
					const json_value Check = rStart[i]["blocked"];
					if(Check.type == json_boolean && Check)
						CountryFlag.m_Blocked = true;
					m_aCountryFlags.add_unsorted(CountryFlag);

					// print message
					if(Config()->m_Debug)
					{
						str_format(aBuf, sizeof(aBuf), "loaded country flag '%s'", pCountryName);
						Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "countryflags", aBuf);
					}
				}
			}
		}
	}

	// clean up
	json_value_free(pJsonData);
	m_aCountryFlags.sort_range();

	// find index of default item
	int DefaultIndex = 0, Index = 0;
	for(sorted_array<CCountryFlag>::range r = m_aCountryFlags.all(); !r.empty(); r.pop_front(), ++Index)
		if(r.front().m_CountryCode == -1)
		{
			DefaultIndex = Index;
			break;
		}

	// init LUT
	if(DefaultIndex != 0)
		for(int i = 0; i < CODE_RANGE; ++i)
			m_CodeIndexLUT[i] = DefaultIndex;
	else
		mem_zero(m_CodeIndexLUT, sizeof(m_CodeIndexLUT));
	for(int i = 0; i < m_aCountryFlags.size(); ++i)
		m_CodeIndexLUT[maximum(0, (m_aCountryFlags[i].m_CountryCode-CODE_LB)%CODE_RANGE)] = i;
}